

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::TypenameFunction::TypenameFunction(TypenameFunction *this)

{
  allocator<char> local_31;
  string local_30;
  TypenameFunction *local_10;
  TypenameFunction *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$typename",&local_31);
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__TypenameFunction_00916d40;
  return;
}

Assistant:

TypenameFunction() : SystemSubroutine("$typename", SubroutineKind::Function) {}